

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

void rhash_sha512_update(sha512_ctx *ctx,uchar *msg,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  size_t local_50;
  sha512_ctx *local_38;
  uint64_t *aligned_message_block;
  size_t left;
  size_t index;
  size_t size_local;
  uchar *msg_local;
  sha512_ctx *ctx_local;
  
  uVar1 = ctx->length & 0x7f;
  ctx->length = size + ctx->length;
  index = size;
  size_local = (size_t)msg;
  if (uVar1 != 0) {
    uVar2 = 0x80 - uVar1;
    local_50 = uVar2;
    if (size < uVar2) {
      local_50 = size;
    }
    memcpy((void *)((long)ctx->message + uVar1),msg,local_50);
    if (size < uVar2) {
      return;
    }
    rhash_sha512_process_block(ctx->hash,ctx->message);
    size_local = (size_t)(msg + uVar2);
    index = size - uVar2;
  }
  for (; 0x7f < index; index = index - 0x80) {
    if ((size_local & 7) == 0) {
      local_38 = (sha512_ctx *)size_local;
    }
    else {
      memcpy(ctx,(void *)size_local,0x80);
      local_38 = ctx;
    }
    rhash_sha512_process_block(ctx->hash,local_38->message);
    size_local = size_local + 0x80;
  }
  if (index != 0) {
    memcpy(ctx,(void *)size_local,index);
  }
  return;
}

Assistant:

void rhash_sha512_update(sha512_ctx* ctx, const unsigned char* msg, size_t size)
{
	size_t index = (size_t)ctx->length & 127;
	ctx->length += size;

	/* fill partial block */
	if (index) {
		size_t left = sha512_block_size - index;
		memcpy((char*)ctx->message + index, msg, (size < left ? size : left));
		if (size < left) return;

		/* process partial block */
		rhash_sha512_process_block(ctx->hash, ctx->message);
		msg  += left;
		size -= left;
	}
	while (size >= sha512_block_size) {
		uint64_t* aligned_message_block;
		if (IS_ALIGNED_64(msg)) {
			/* the most common case is processing of an already aligned message
			without copying it */
			aligned_message_block = (uint64_t*)msg;
		} else {
			memcpy(ctx->message, msg, sha512_block_size);
			aligned_message_block = ctx->message;
		}

		rhash_sha512_process_block(ctx->hash, aligned_message_block);
		msg  += sha512_block_size;
		size -= sha512_block_size;
	}
	if (size) {
		memcpy(ctx->message, msg, size); /* save leftovers */
	}
}